

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DistItemSyntax::getChild(DistItemSyntax *this,size_t index)

{
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  ConstTokenOrSyntax *pCVar1;
  
  if (in_RDX == 0) {
    pCVar1 = in_RDI;
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 1));
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    pCVar1 = in_RDI;
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
    pCVar1 = in_RDI;
  }
  return pCVar1;
}

Assistant:

ConstTokenOrSyntax DistItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return range.get();
        case 1: return weight;
        default: return nullptr;
    }
}